

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O3

void __thiscall
duckdb::BaseColumnPruner::VisitExpression
          (BaseColumnPruner *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  bool bVar1;
  type expr;
  
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (expression);
  bVar1 = HandleStructExtract(this,expr);
  if (bVar1) {
    return;
  }
  LogicalOperatorVisitor::VisitExpression(&this->super_LogicalOperatorVisitor,expression);
  return;
}

Assistant:

void BaseColumnPruner::VisitExpression(unique_ptr<Expression> *expression) {
	auto &expr = **expression;
	if (HandleStructExtract(expr)) {
		// already handled
		return;
	}
	// recurse
	LogicalOperatorVisitor::VisitExpression(expression);
}